

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

shared_ptr<unsigned_short> __thiscall
chaiscript::bootstrap::detail::construct_pod<unsigned_short>(detail *this,Boxed_Number *v)

{
  shared_ptr<unsigned_short> sVar1;
  
  Boxed_Number::get_as<unsigned_short>(v);
  sVar1 = std::make_shared<unsigned_short,unsigned_short>((unsigned_short *)this);
  sVar1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<unsigned_short>)
         sVar1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<P1> construct_pod(const Boxed_Number &v)
      {
        return std::make_shared<P1>(v.get_as<P1>());
      }